

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adplanner.cpp
# Opt level: O3

void __thiscall
ADPlanner::UpdatePredsofUnderconsState
          (ADPlanner *this,ADState *state,ADSearchStateSpace_t *pSearchStateSpace)

{
  DiscreteSpaceInformation *pDVar1;
  vector<int,_std::allocator<int>_> PredIDV;
  vector<int,_std::allocator<int>_> CostV;
  
  pDVar1 = (this->super_SBPLPlanner).environment_;
  (*pDVar1->_vptr_DiscreteSpaceInformation[0xb])(pDVar1,(ulong)**(uint **)(state + 0x18));
  return;
}

Assistant:

void ADPlanner::UpdatePredsofUnderconsState(ADState* state, ADSearchStateSpace_t* pSearchStateSpace)
{
    vector<int> PredIDV;
    vector<int> CostV;
    CKey key;
    ADState *predstate;

    environment_->GetPreds(state->MDPstate->StateID, &PredIDV, &CostV);

    //iterate through predecessors of s
    for (int pind = 0; pind < (int)PredIDV.size(); pind++) {

        CMDPSTATE* PredMDPState = GetState(PredIDV[pind], pSearchStateSpace);
        predstate = (ADState*)(PredMDPState->PlannerSpecificData);
        if (predstate->callnumberaccessed != pSearchStateSpace->callnumber) {
            ReInitializeSearchStateInfo(predstate, pSearchStateSpace);
        }

        if (predstate->bestnextstate == state->MDPstate) {
            Recomputegval(predstate);
            UpdateSetMembership(predstate);

#if DEBUG
            if(predstate->MDPstate->StateID == 679256)
            {
                SBPL_FPRINTF(fDeb, "updated pred %d of undercons exp\n", predstate->MDPstate->StateID);
                PrintSearchState(predstate, fDeb);
                SBPL_FPRINTF(fDeb, "\n");
            }
#endif
        }
    } //for predecessors
}